

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_ctx.c
# Opt level: O3

void BN_CTX_free(BN_CTX *c)

{
  int iVar1;
  BIGNUM *a;
  
  if (c != (BN_CTX *)0x0) {
    CRYPTO_free(*(void **)(c + 0x20));
    *(undefined8 *)(c + 0x20) = 0;
    a = *(BIGNUM **)c;
    if (a != (BIGNUM *)0x0) {
      iVar1 = 1;
      do {
        do {
          if (a->d != (ulong *)0x0) {
            BN_clear_free(a);
          }
          a = a + 1;
          iVar1 = iVar1 + 1;
        } while (iVar1 != 0x11);
        *(undefined8 *)(c + 8) = *(undefined8 *)((long)*(void **)c + 0x188);
        CRYPTO_free(*(void **)c);
        a = *(BIGNUM **)(c + 8);
        *(BIGNUM **)c = a;
        iVar1 = 1;
      } while (a != (BIGNUM *)0x0);
    }
    CRYPTO_free(c);
    return;
  }
  return;
}

Assistant:

void BN_CTX_free(BN_CTX *ctx)
{
    if (ctx == NULL)
        return;
#ifdef BN_CTX_DEBUG
    {
        BN_POOL_ITEM *pool = ctx->pool.head;
        fprintf(stderr, "BN_CTX_free, stack-size=%d, pool-bignums=%d\n",
                ctx->stack.size, ctx->pool.size);
        fprintf(stderr, "dmaxs: ");
        while (pool) {
            unsigned loop = 0;
            while (loop < BN_CTX_POOL_SIZE)
                fprintf(stderr, "%02x ", pool->vals[loop++].dmax);
            pool = pool->next;
        }
        fprintf(stderr, "\n");
    }
#endif
    BN_STACK_finish(&ctx->stack);
    BN_POOL_finish(&ctx->pool);
    CRYPTO_free(ctx);
}